

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

ptrdiff_t mp_check_binl(char *cur,char *end)

{
  byte bVar1;
  
  if (end <= cur + 1) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0xa3f,"ptrdiff_t mp_check_binl(const char *, const char *)");
  }
  bVar1 = *cur;
  if (mp_type_hint[bVar1] == MP_BIN) {
    if ((byte)(bVar1 + 0x3c) < 3) {
      return (ptrdiff_t)(cur + 1 + ((1L << (bVar1 & 3)) - (long)end));
    }
    __assert_fail("c >= 0xc4 && c <= 0xc6",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0xa42,"ptrdiff_t mp_check_binl(const char *, const char *)");
  }
  __assert_fail("mp_typeof(c) == MP_BIN",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0xa40,"ptrdiff_t mp_check_binl(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_binl(const char *cur, const char *end)
{
	uint8_t c = mp_load_u8(&cur);
	assert(cur < end);
	assert(mp_typeof(c) == MP_BIN);

	assert(c >= 0xc4 && c <= 0xc6); /* must be checked above by mp_typeof */
	uint32_t hsize = 1U << (c & 0x3); /* 0xc4->1, 0xc5->2, 0xc6->4 */
	return hsize - (end - cur);
}